

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

ObjectPtr<tvm::runtime::GraphRuntime> __thiscall
tvm::runtime::ObjAllocatorBase<tvm::runtime::SimpleObjAllocator>::
make_object<tvm::runtime::GraphRuntime>(ObjAllocatorBase<tvm::runtime::SimpleObjAllocator> *this)

{
  RefCounterType *pRVar1;
  GraphRuntime *pGVar2;
  SimpleObjAllocator *in_RSI;
  
  pGVar2 = SimpleObjAllocator::Handler<tvm::runtime::GraphRuntime>::New<>(in_RSI);
  (pGVar2->super_ModuleNode).super_Object.type_index_ = 3;
  (pGVar2->super_ModuleNode).super_Object.deleter_ =
       SimpleObjAllocator::Handler<tvm::runtime::GraphRuntime>::Deleter_;
  *(Object **)this = &(pGVar2->super_ModuleNode).super_Object;
  LOCK();
  pRVar1 = &(pGVar2->super_ModuleNode).super_Object.ref_counter_;
  (pRVar1->super___atomic_base<int>)._M_i = (pRVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return (ObjectPtr<tvm::runtime::GraphRuntime>)(Object *)this;
}

Assistant:

inline ObjectPtr<T> make_object(Args&&... args) {
    using Handler = typename Derived::template Handler<T>;
    static_assert(std::is_base_of<Object, T>::value,
                  "make can only be used to create Object");
    T* ptr = Handler::New(static_cast<Derived*>(this),
                         std::forward<Args>(args)...);
    ptr->type_index_ = T::RuntimeTypeIndex();
    ptr->deleter_ = Handler::Deleter();
    return ObjectPtr<T>(ptr);
  }